

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::ComputeGravityForces
          (ChElementCableANCF *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  double dVar1;
  undefined1 (*pauVar2) [64];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0xc)
  {
    pauVar2 = (undefined1 (*) [64])
              (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar6 = *(undefined1 (*) [32])
              (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array;
    dVar1 = G_acc->m_data[0];
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar4._16_8_ = dVar1;
    auVar4._24_8_ = dVar1;
    auVar4 = vmulpd_avx512vl(auVar6,auVar4);
    dVar1 = G_acc->m_data[1];
    auVar5._8_8_ = dVar1;
    auVar5._0_8_ = dVar1;
    auVar5._16_8_ = dVar1;
    auVar5._24_8_ = dVar1;
    auVar5 = vmulpd_avx512vl(auVar6,auVar5);
    dVar1 = G_acc->m_data[2];
    auVar3._8_8_ = dVar1;
    auVar3._0_8_ = dVar1;
    auVar3._16_8_ = dVar1;
    auVar3._24_8_ = dVar1;
    auVar6 = vmulpd_avx512vl(auVar6,auVar3);
    auVar7 = vinsertf64x4_avx512f(ZEXT3264(auVar4),auVar5,1);
    auVar7 = vpermi2pd_avx512f(_DAT_009ad340,auVar7,ZEXT3264(auVar6));
    *pauVar2 = auVar7;
    auVar6 = vpermi2pd_avx512vl(_DAT_009ad500,auVar6,auVar4);
    auVar6 = vpermi2pd_avx512vl(_DAT_009ad520,auVar6,auVar5);
    *(undefined1 (*) [32])pauVar2[1] = auVar6;
    return;
  }
  __assert_fail("Fg.size() == 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                ,0x276,
                "virtual void chrono::fea::ChElementCableANCF::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementCableANCF::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 12);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<ChMatrixNM<double, 4, 3>> GravForceCompact(Fg.data(), 4, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}